

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O0

void __thiscall
r_comp::Decompiler::write_any
          (Decompiler *this,uint16_t read_index,bool *after_tail_wildcard,bool apply_time_offset,
          uint16_t write_as_view_index)

{
  uint uVar1;
  ImageObject *pIVar2;
  Metadata *pMVar3;
  byte bVar4;
  undefined1 uVar5;
  char cVar6;
  bool bVar7;
  short sVar8;
  ushort uVar9;
  Atom *pAVar10;
  offset_in_Decompiler_to_subr *poVar11;
  OutStream *pOVar12;
  uint *puVar13;
  SysObject **ppSVar14;
  Class *pCVar15;
  pointer ppVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  long *plVar17;
  uint16_t index_00;
  code *local_3d0;
  char local_332;
  bool local_331;
  undefined1 local_330 [40];
  undefined1 local_308 [40];
  string local_2e0 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
  local_2c0;
  allocator local_2b1;
  string local_2b0 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
  local_290;
  allocator local_281;
  string local_280 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
  local_260;
  undefined1 local_258 [8];
  Class view_class;
  undefined1 local_208 [40];
  string member_name;
  undefined2 local_1c2;
  undefined1 local_1c0 [6];
  uint16_t i;
  Class embedding_class;
  uint64_t object_index;
  byte local_12a;
  allocator local_129;
  string local_128 [6];
  uint8_t cast_opcode;
  undefined2 local_104;
  ushort local_102;
  DebugStream local_100 [4];
  uint16_t member_count;
  uint16_t opcode;
  __buckets_ptr local_e0;
  uint64_t ts;
  Atom local_d0 [8];
  string s_2;
  undefined4 local_ac;
  undefined1 local_a8 [4];
  Atom first;
  string s_1;
  undefined1 local_88 [32];
  undefined1 local_68 [8];
  string s;
  char local_47;
  ushort local_46;
  Atom local_44 [4];
  uint16_t uStack_40;
  uint16_t index;
  Atom atom;
  Atom local_38 [16];
  uint local_28;
  uint16_t local_24;
  byte local_21;
  Atom a;
  uint16_t write_as_view_index_local;
  bool apply_time_offset_local;
  bool *after_tail_wildcard_local;
  uint16_t read_index_local;
  Decompiler *this_local;
  
  local_24 = write_as_view_index;
  local_21 = apply_time_offset;
  _a = (__node_base_ptr)after_tail_wildcard;
  pAVar10 = r_code::vector<r_code::Atom>::operator[]
                      ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)read_index);
  local_28 = *(uint *)pAVar10;
  bVar4 = r_code::Atom::isFloat();
  if ((bVar4 & 1) != 0) {
    if (local_28 == 0x3fffffff) {
      OutStream::push<char[4]>(this->out_stream,(char (*) [4])"|nb",read_index);
    }
    else {
      r_code::Atom::PlusInfinity();
      bVar4 = r_code::Atom::operator==((Atom *)&local_28,local_38);
      r_code::Atom::~Atom(local_38);
      if ((bVar4 & 1) == 0) {
        OutStream::operator<<(this->out_stream,std::dec);
        pOVar12 = this->out_stream;
        _atom = r_code::Atom::asFloat();
        OutStream::push<float>(pOVar12,(float *)&atom,read_index);
      }
      else {
        OutStream::push<char[8]>(this->out_stream,(char (*) [8])"forever",read_index);
      }
    }
    uStack_40 = 1;
    index = 0;
    goto LAB_001ab6ba;
  }
  r_code::Atom::Atom(local_44,0xffffffff);
  uVar5 = r_code::Atom::getDescriptor();
  index_00 = (uint16_t)this;
  switch(uVar5) {
  case 0x80:
    OutStream::push<char[4]>(this->out_stream,(char (*) [4])"nil",read_index);
    break;
  case 0x81:
    bVar4 = r_code::Atom::readsAsNil();
    if ((bVar4 & 1) == 0) {
      OutStream::operator<<(this->out_stream,std::boolalpha);
      pOVar12 = this->out_stream;
      bVar4 = r_code::Atom::asBoolean();
      local_331 = (bool)(bVar4 & 1);
      OutStream::push<bool>(pOVar12,&local_331,read_index);
    }
    else {
      OutStream::push<char[4]>(this->out_stream,(char (*) [4])"|bl",read_index);
    }
    break;
  case 0x82:
    if (((ulong)_a->_M_nxt & 1) == 0) {
      local_332 = ':';
      OutStream::push<char>(this->out_stream,&local_332,read_index);
    }
    else {
      OutStream::push(this->out_stream);
    }
    break;
  case 0x83:
    OutStream::push<char[3]>(this->out_stream,(char (*) [3])"::",read_index);
    *(bool *)&_a->_M_nxt = true;
    break;
  case 0x84:
    goto switchD_001a9db3_caseD_84;
  case 0x85:
    pOVar12 = this->out_stream;
    pIVar2 = this->current_object;
    uVar9 = r_code::Atom::asIndex();
    r_code::vector<unsigned_int>::operator[]((vector<unsigned_int> *)(pIVar2 + 0x20),(ulong)uVar9);
    get_object_name_abi_cxx11_((Decompiler *)local_330,index_00);
    OutStream::push<std::__cxx11::string>
              (pOVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_330,read_index);
    std::__cxx11::string::~string((string *)local_330);
    break;
  case 0x86:
    if ((this->in_hlp & 1U) == 0) goto switchD_001a9db3_caseD_8d;
    sVar8 = r_code::Atom::asCastOpcode();
    if (sVar8 == 0xffe) {
      local_47 = ':';
      OutStream::push<char>(this->out_stream,&local_47,read_index);
    }
    else {
      r_code::Atom::asIndex();
      get_hlp_variable_name_abi_cxx11_((Decompiler *)local_68,index_00);
      OutStream::push<std::__cxx11::string>
                (this->out_stream,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                 read_index);
      std::__cxx11::string::~string((string *)local_68);
    }
    break;
  default:
    OutStream::push<char[3]>(this->out_stream,(char (*) [3])"0x",read_index);
    OutStream::operator<<(this->out_stream,std::hex);
    OutStream::operator<<(this->out_stream,&local_28);
    break;
  case 0x8d:
switchD_001a9db3_caseD_8d:
    if ((this->in_hlp & 1U) != 0) {
      pOVar12 = this->out_stream;
      r_code::Atom::asAssignmentIndex();
      get_hlp_variable_name_abi_cxx11_((Decompiler *)local_88,index_00);
      OutStream::push<std::__cxx11::string>
                (pOVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_88,read_index);
      std::__cxx11::string::~string((string *)local_88);
      OutStream::operator<<(this->out_stream,(char (*) [2])0x1ca8de);
    }
switchD_001a9db3_caseD_84:
    local_46 = r_code::Atom::asIndex();
    pAVar10 = r_code::vector<r_code::Atom>::operator[]
                        ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)local_46);
    r_code::Atom::operator=(local_44,pAVar10);
    while (cVar6 = r_code::Atom::getDescriptor(), uVar9 = local_46, cVar6 == -0x7c) {
      local_46 = r_code::Atom::asIndex();
      pAVar10 = r_code::vector<r_code::Atom>::operator[]
                          ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)local_46);
      r_code::Atom::operator=(local_44,pAVar10);
    }
    if (local_46 < read_index) {
      r_code::Atom::getDescriptor();
      get_variable_name_abi_cxx11_((Decompiler *)local_a8,index_00,SUB21(uVar9,0));
      OutStream::push<std::__cxx11::string>
                (this->out_stream,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                 read_index);
      uStack_40 = 2;
      index = 0;
      std::__cxx11::string::~string((string *)local_a8);
      break;
    }
    uVar5 = r_code::Atom::getDescriptor();
    switch(uVar5) {
    case 0xc0:
      bVar4 = r_code::Atom::getAtomCount();
      local_104 = ZEXT12(bVar4);
      pAVar10 = r_code::vector<r_code::Atom>::operator[]
                          ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)(local_46 + 1))
      ;
      r_code::Atom::operator=(local_44,pAVar10);
      cVar6 = r_code::Atom::getDescriptor();
      if (cVar6 == -0x7b) {
        pIVar2 = this->current_object;
        uVar9 = r_code::Atom::asIndex();
        puVar13 = r_code::vector<unsigned_int>::operator[]
                            ((vector<unsigned_int> *)(pIVar2 + 0x20),(ulong)uVar9);
        uVar1 = *puVar13;
        pOVar12 = this->out_stream;
        get_object_name_abi_cxx11_((Decompiler *)&embedding_class.type,index_00);
        OutStream::push<std::__cxx11::string>
                  (pOVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &embedding_class.type,read_index);
        std::__cxx11::string::~string((string *)&embedding_class.type);
        ppSVar14 = r_code::vector<r_code::SysObject_*>::operator[]
                             (&(this->image->code_segment).objects,(ulong)uVar1);
        r_code::vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(*ppSVar14 + 8),0);
        local_102 = r_code::Atom::asOpcode();
LAB_001aaad3:
        pCVar15 = r_code::vector<r_comp::Class>::operator[]
                            (&this->metadata->classes_by_opcodes,(ulong)local_102);
        Class::Class((Class *)local_1c0,pCVar15);
        for (local_1c2 = 2; (ushort)local_1c2 <= (ushort)local_104; local_1c2 = local_1c2 + 1) {
          std::__cxx11::string::string((string *)(local_208 + 0x20));
          pAVar10 = r_code::vector<r_code::Atom>::operator[]
                              ((vector<r_code::Atom> *)(this->current_object + 8),
                               (ulong)((uint)local_46 + (uint)(ushort)local_1c2));
          r_code::Atom::operator=(local_44,pAVar10);
          cVar6 = r_code::Atom::getDescriptor();
          if (cVar6 == -0x6f) {
            std::__cxx11::string::operator=((string *)(local_208 + 0x20),"vw");
          }
          else if (cVar6 == -0x6e) {
            std::__cxx11::string::operator=((string *)(local_208 + 0x20),"mks");
          }
          else if (cVar6 == -0x6d) {
            std::__cxx11::string::operator=((string *)(local_208 + 0x20),"vws");
          }
          else {
            r_code::Atom::asIndex();
            Class::get_member_name_abi_cxx11_((Class *)local_208,(uint64_t)local_1c0);
            std::__cxx11::string::operator=((string *)(local_208 + 0x20),(string *)local_208);
            std::__cxx11::string::~string((string *)local_208);
            if ((ushort)local_1c2 < (ushort)local_104) {
              pCVar15 = Class::get_member_class
                                  ((Class *)local_1c0,this->metadata,(string *)(local_208 + 0x20));
              Class::operator=((Class *)local_1c0,pCVar15);
            }
          }
          view_class.use_as._3_1_ = 0x2e;
          pOVar12 = OutStream::operator<<(this->out_stream,(char *)((long)&view_class.use_as + 3));
          OutStream::operator<<
                    (pOVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_208 + 0x20));
          bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(local_208 + 0x20),"vw");
          if (bVar7) {
            pAVar10 = r_code::vector<r_code::Atom>::operator[]
                                ((vector<r_code::Atom> *)(this->current_object + 8),
                                 (ulong)((uint)local_46 + (uint)(ushort)local_104));
            r_code::Atom::operator=(local_44,pAVar10);
            Class::Class((Class *)local_258,ANY);
            bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&embedding_class,"grp");
            if (bVar7) {
              pMVar3 = this->metadata;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_280,"grp_view",&local_281);
              local_260._M_cur =
                   (__node_type *)
                   std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
                   ::find(&pMVar3->classes,(key_type *)local_280);
              ppVar16 = std::__detail::
                        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
                        ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
                                      *)&local_260);
              Class::operator=((Class *)local_258,&ppVar16->second);
              std::__cxx11::string::~string(local_280);
              std::allocator<char>::~allocator((allocator<char> *)&local_281);
            }
            else {
              bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&embedding_class,"ipgm");
              if (((bVar7) ||
                  (bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&embedding_class,"icpp_pgm"), bVar7)) ||
                 ((bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&embedding_class,"mdl"), bVar7 ||
                  (bVar7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&embedding_class,"cst"), bVar7)))) {
                pMVar3 = this->metadata;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_2b0,"pgm_view",&local_2b1);
                local_290._M_cur =
                     (__node_type *)
                     std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
                     ::find(&pMVar3->classes,(key_type *)local_2b0);
                ppVar16 = std::__detail::
                          _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
                          ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
                                        *)&local_290);
                Class::operator=((Class *)local_258,&ppVar16->second);
                std::__cxx11::string::~string(local_2b0);
                std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
              }
              else {
                pMVar3 = this->metadata;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_2e0,"view",(allocator *)(local_308 + 0x27));
                local_2c0._M_cur =
                     (__node_type *)
                     std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
                     ::find(&pMVar3->classes,(key_type *)local_2e0);
                ppVar16 = std::__detail::
                          _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
                          ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
                                        *)&local_2c0);
                Class::operator=((Class *)local_258,&ppVar16->second);
                std::__cxx11::string::~string(local_2e0);
                std::allocator<char>::~allocator((allocator<char> *)(local_308 + 0x27));
              }
            }
            r_code::Atom::asIndex();
            Class::get_member_name_abi_cxx11_((Class *)local_308,(uint64_t)local_258);
            std::__cxx11::string::operator=((string *)(local_208 + 0x20),(string *)local_308);
            std::__cxx11::string::~string((string *)local_308);
            local_330[0x27] = 0x2e;
            pOVar12 = OutStream::operator<<(this->out_stream,local_330 + 0x27);
            OutStream::operator<<
                      (pOVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (local_208 + 0x20));
            _uStack_40 = 9;
            Class::~Class((Class *)local_258);
          }
          else {
            _uStack_40 = 0;
          }
          std::__cxx11::string::~string((string *)(local_208 + 0x20));
          if (_uStack_40 != 0) break;
        }
        uStack_40 = 5;
        index = 0;
        Class::~Class((Class *)local_1c0);
        break;
      }
      if (cVar6 == -0x7a) {
        local_12a = r_code::Atom::asCastOpcode();
        while( true ) {
          pIVar2 = this->current_object;
          uVar9 = r_code::Atom::asIndex();
          r_code::vector<r_code::Atom>::operator[]
                    ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar9);
          cVar6 = r_code::Atom::getDescriptor();
          if (cVar6 != -0x7c) break;
          pIVar2 = this->current_object;
          uVar9 = r_code::Atom::asIndex();
          pAVar10 = r_code::vector<r_code::Atom>::operator[]
                              ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar9);
          r_code::Atom::operator=(local_44,pAVar10);
        }
        pOVar12 = this->out_stream;
        bVar7 = (bool)r_code::Atom::asIndex();
        pIVar2 = this->current_object;
        uVar9 = r_code::Atom::asIndex();
        r_code::vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar9);
        r_code::Atom::getDescriptor();
        get_variable_name_abi_cxx11_((Decompiler *)&object_index,index_00,bVar7);
        OutStream::push<std::__cxx11::string>
                  (pOVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &object_index,read_index);
        std::__cxx11::string::~string((string *)&object_index);
        if (local_12a == 0xff) {
          pIVar2 = this->current_object;
          uVar9 = r_code::Atom::asIndex();
          r_code::vector<r_code::Atom>::operator[]
                    ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar9);
          cVar6 = r_code::Atom::getDescriptor();
          if (cVar6 == -0x7e) {
            pIVar2 = this->current_object;
            uVar9 = r_code::Atom::asIndex();
            r_code::vector<r_code::Atom>::operator[]
                      ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar9);
            local_102 = r_code::Atom::asOpcode();
          }
          else {
            pIVar2 = this->current_object;
            uVar9 = r_code::Atom::asIndex();
            r_code::vector<r_code::Atom>::operator[]
                      ((vector<r_code::Atom> *)(pIVar2 + 8),(ulong)uVar9);
            local_102 = r_code::Atom::asOpcode();
          }
        }
        else {
          local_102 = (ushort)local_12a;
        }
        goto LAB_001aaad3;
      }
      if (cVar6 == -0x70) {
        OutStream::push<char[5]>(this->out_stream,(char (*) [5])"this",read_index);
        pMVar3 = this->metadata;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_128,"ipgm",&local_129);
        std::
        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
        ::operator[](&pMVar3->sys_classes,(key_type *)local_128);
        local_102 = r_code::Atom::asOpcode();
        std::__cxx11::string::~string(local_128);
        std::allocator<char>::~allocator((allocator<char> *)&local_129);
        goto LAB_001aaad3;
      }
      OutStream::push<char[23]>(this->out_stream,(char (*) [23])"unknown-cptr-lead-type",read_index)
      ;
      uStack_40 = 1;
      index = 0;
      goto LAB_001ab6b1;
    case 0xc1:
    case 0xc2:
      bVar4 = r_code::Atom::readsAsNil();
      if ((bVar4 & 1) == 0) {
        write_set(this,local_46,(bool)(local_21 & 1),local_24);
      }
      else {
        OutStream::push<char[4]>(this->out_stream,(char (*) [4])0x1cae0c,read_index);
      }
      break;
    case 0xc3:
    case 0xc4:
    case 0xc5:
    case 200:
    case 0xc9:
    case 0xca:
    case 0xcb:
    case 0xcc:
    case 0xcd:
    case 0xce:
      uVar9 = r_code::Atom::asOpcode();
      poVar11 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                          (&this->renderers,(ulong)uVar9);
      local_3d0 = (code *)*poVar11;
      plVar17 = (long *)((long)&this->out_stream + poVar11[1]);
      if (((ulong)local_3d0 & 1) != 0) {
        local_3d0 = *(code **)(local_3d0 + *plVar17 + -1);
      }
      (*local_3d0)(plVar17,local_46);
      break;
    case 0xc6:
      bVar4 = r_code::Atom::readsAsNil();
      if ((bVar4 & 1) == 0) {
        pAVar10 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(this->current_object + 8),
                             (ulong)(local_46 + 1));
        local_ac = *(undefined4 *)pAVar10;
        r_code::vector<r_code::Atom>::operator[]
                  ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)local_46);
        r_code::Utils::GetString_abi_cxx11_(local_d0);
        ts._7_1_ = 0x22;
        pOVar12 = OutStream::operator<<(this->out_stream,(char *)((long)&ts + 7));
        pOVar12 = OutStream::operator<<
                            (pOVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_d0);
        ts._6_1_ = 0x22;
        OutStream::operator<<(pOVar12,(char *)((long)&ts + 6));
        std::__cxx11::string::~string((string *)local_d0);
        r_code::Atom::~Atom((Atom *)&local_ac);
      }
      else {
        OutStream::push<char[4]>(this->out_stream,(char (*) [4])"|st",read_index);
      }
      break;
    case 199:
      bVar4 = r_code::Atom::readsAsNil();
      if ((bVar4 & 1) == 0) {
        pAVar10 = r_code::vector<r_code::Atom>::operator[]
                            ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)local_46);
        local_e0 = (__buckets_ptr)r_code::Utils::GetTimestamp(pAVar10);
        if ((((this->in_hlp & 1U) == 0) && (local_e0 != (__buckets_ptr)0x0)) &&
           ((local_21 & 1) != 0)) {
          local_e0 = (__buckets_ptr)((long)local_e0 - this->time_offset);
        }
        pOVar12 = this->out_stream;
        DebugStream::timestamp_abi_cxx11_(local_100,(uint64_t)local_e0);
        OutStream::push<std::__cxx11::string>
                  (pOVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_100,read_index);
        std::__cxx11::string::~string((string *)local_100);
      }
      else {
        OutStream::push<char[4]>(this->out_stream,(char (*) [4])"|us",read_index);
      }
      break;
    default:
      OutStream::push<char[39]>
                (this->out_stream,(char (*) [39])"undefined-structural-atom-or-reference",read_index
                );
    }
    break;
  case 0x90:
    OutStream::push<char[5]>(this->out_stream,(char (*) [5])"this",read_index);
    break;
  case 0x91:
    OutStream::push<char[3]>(this->out_stream,(char (*) [3])"vw",read_index);
    break;
  case 0x92:
    OutStream::push<char[4]>(this->out_stream,(char (*) [4])"mks",read_index);
    break;
  case 0x93:
    OutStream::push<char[4]>(this->out_stream,(char (*) [4])"vws",read_index);
    break;
  case 0xa0:
    bVar4 = r_code::Atom::readsAsNil();
    if ((bVar4 & 1) == 0) {
      OutStream::push<char[3]>(this->out_stream,(char (*) [3])"0x",read_index);
      OutStream::operator<<(this->out_stream,std::hex);
      OutStream::operator<<(this->out_stream,&local_28);
    }
    else {
      OutStream::push<char[5]>(this->out_stream,(char (*) [5])"|sid",read_index);
    }
    break;
  case 0xa1:
    bVar4 = r_code::Atom::readsAsNil();
    if ((bVar4 & 1) == 0) {
      OutStream::push<char[3]>(this->out_stream,(char (*) [3])"0x",read_index);
      OutStream::operator<<(this->out_stream,std::hex);
      OutStream::operator<<(this->out_stream,&local_28);
    }
    else {
      OutStream::push<char[5]>(this->out_stream,(char (*) [5])"|did",read_index);
    }
    break;
  case 0xa2:
    bVar4 = r_code::Atom::readsAsNil();
    if ((bVar4 & 1) == 0) {
      pOVar12 = this->out_stream;
      pMVar3 = this->metadata;
      uVar9 = r_code::Atom::asOpcode();
      t = r_code::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator[](&pMVar3->function_names,(ulong)uVar9);
      OutStream::push<std::__cxx11::string>(pOVar12,t,read_index);
    }
    else {
      OutStream::push<char[5]>(this->out_stream,(char (*) [5])"|fid",read_index);
    }
  }
  uStack_40 = 0;
  index = 0;
LAB_001ab6b1:
  r_code::Atom::~Atom(local_44);
LAB_001ab6ba:
  r_code::Atom::~Atom((Atom *)&local_28);
  return;
}

Assistant:

void Decompiler::write_any(uint16_t read_index, bool &after_tail_wildcard, bool apply_time_offset, uint16_t write_as_view_index)   // after_tail_wildcard meant to avoid printing ':' after "::".
{
    Atom a = current_object->code[read_index];

    if (a.isFloat()) {
        if (a.atom == 0x3FFFFFFF) {
            out_stream->push("|nb", read_index);
        } else if (a == Atom::PlusInfinity()) {
            out_stream->push("forever", read_index);
        } else {
            *out_stream << std::dec;
            out_stream->push(a.asFloat(), read_index);
        }

        return;
    }

    Atom atom;
    uint16_t index;

    switch (a.getDescriptor()) {
    case Atom::VL_PTR:
        if (in_hlp) {
            if (a.asCastOpcode() == 0x0FFE) {
                out_stream->push(':', read_index);
            } else {
                std::string s = get_hlp_variable_name(a.asIndex());
                out_stream->push(s, read_index);
            }

            break;
        }

    case Atom::ASSIGN_PTR:
        if (in_hlp) {
            out_stream->push(get_hlp_variable_name(a.asAssignmentIndex()), read_index);
            *out_stream << ":";
        }

    case Atom::I_PTR:
        index = a.asIndex();
        atom = current_object->code[index];

        while (atom.getDescriptor() == Atom::I_PTR) {
            index = atom.asIndex();
            atom = current_object->code[index];
        }

        if (index < read_index) { // reference to a label or variable.
            std::string s = get_variable_name(index, atom.getDescriptor() != Atom::WILDCARD); // post-fix labels with ':' (no need for variables since they are inserted just before wildcards).
            out_stream->push(s, read_index);
            break;
        }

        switch (atom.getDescriptor()) { // structures.
        case Atom::OBJECT:
        case Atom::MARKER:
        case Atom::GROUP:
        case Atom::INSTANTIATED_PROGRAM:
        case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
        case Atom::INSTANTIATED_ANTI_PROGRAM:
        case Atom::INSTANTIATED_CPP_PROGRAM:
        case Atom::COMPOSITE_STATE:
        case Atom::MODEL:
        case Atom::OPERATOR:
            (this->*renderers[atom.asOpcode()])(index);
            break;

        case Atom::SET:
        case Atom::S_SET:
            if (atom.readsAsNil()) {
                out_stream->push("|[]", read_index);
            } else {
                write_set(index, apply_time_offset, write_as_view_index);
            }

            break;

        case Atom::STRING:
            if (atom.readsAsNil()) {
                out_stream->push("|st", read_index);
            } else {
                Atom first = current_object->code[index + 1];
                std::string s = Utils::GetString(&current_object->code[index]);
                *out_stream << '\"' << s << '\"';
            }

            break;

        case Atom::TIMESTAMP:
            if (atom.readsAsNil()) {
                out_stream->push("|us", read_index);
            } else {
                uint64_t ts = Utils::GetTimestamp(&current_object->code[index]);

                if (!in_hlp && ts > 0 && apply_time_offset) {
                    ts -= time_offset;
                }

                out_stream->push(DebugStream::timestamp(ts), read_index);
            }

            break;

        case Atom::C_PTR: {
            uint16_t opcode;
            uint16_t member_count = atom.getAtomCount();
            atom = current_object->code[index + 1]; // current_object->code[index] is the cptr; lead atom is at index+1; iptrs start at index+2.

            switch (atom.getDescriptor()) {
            case Atom::THIS: // this always refers to an instantiated reactive object.
                out_stream->push("this", read_index);
                opcode = metadata->sys_classes["ipgm"].atom.asOpcode();
                break;

            case Atom::VL_PTR: {
                uint8_t cast_opcode = atom.asCastOpcode();

                while (current_object->code[atom.asIndex()].getDescriptor() == Atom::I_PTR) { // position to a structure or an atomic value.
                    atom = current_object->code[atom.asIndex()];
                }

                out_stream->push(get_variable_name(atom.asIndex(), current_object->code[atom.asIndex()].getDescriptor() != Atom::WILDCARD), read_index);

                if (cast_opcode == 0xFF) {
                    if (current_object->code[atom.asIndex()].getDescriptor() == Atom::WILDCARD) {
                        opcode = current_object->code[atom.asIndex()].asOpcode();
                    } else {
                        opcode = current_object->code[atom.asIndex()].asOpcode();
                    }
                } else {
                    opcode = cast_opcode;
                }

                break;
            }

            case Atom::R_PTR: {
                uint64_t object_index = current_object->references[atom.asIndex()];
                out_stream->push(get_object_name(object_index), read_index);
                opcode = image->code_segment.objects[object_index]->code[0].asOpcode();
                break;
            }

            default:
                out_stream->push("unknown-cptr-lead-type", read_index);
                return;
            }

            Class embedding_class = metadata->classes_by_opcodes[opcode]; // class defining the members.

            for (uint16_t i = 2; i <= member_count; ++i) { // get the class of the pointed structure and retrieve the member name from i.
                std::string member_name;
                atom = current_object->code[index + i]; // atom is an iptr appearing after the leading atom in the cptr.

                switch (atom.getDescriptor()) {
                case Atom::VIEW:
                    member_name = "vw";
                    break;

                case Atom::MKS:
                    member_name = "mks";
                    break;

                case Atom::VWS:
                    member_name = "vws";
                    break;

                default:
                    member_name = embedding_class.get_member_name(atom.asIndex());

                    if (i < member_count) { // not the last member, get the next class.
                        embedding_class = *embedding_class.get_member_class(metadata, member_name);
                    }

                    break;
                }

                *out_stream << '.' << member_name;

                if (member_name == "vw") { // special case: no view structure in the code, vw is just a place holder; vw is the second to last member of the cptr: write the last member and exit.
                    atom = current_object->code[index + member_count]; // atom is the last internal pointer.
                    Class view_class;

                    if (embedding_class.str_opcode == "grp") {
                        view_class = metadata->classes.find("grp_view")->second;
                    } else if (embedding_class.str_opcode == "ipgm" ||
                               embedding_class.str_opcode == "icpp_pgm" ||
                               embedding_class.str_opcode == "mdl" ||
                               embedding_class.str_opcode == "cst") {
                        view_class = metadata->classes.find("pgm_view")->second;
                    } else {
                        view_class = metadata->classes.find("view")->second;
                    }

                    member_name = view_class.get_member_name(atom.asIndex());
                    *out_stream << '.' << member_name;
                    break;
                }
            }

            break;
        }

        default:
            out_stream->push("undefined-structural-atom-or-reference", read_index);
            break;
        }

        break;

    case Atom::R_PTR:
        out_stream->push(get_object_name(current_object->references[a.asIndex()]), read_index);
        break;

    case Atom::THIS:
        out_stream->push("this", read_index);
        break;

    case Atom::NIL:
        out_stream->push("nil", read_index);
        break;

    case Atom::BOOLEAN_:
        if (a.readsAsNil()) {
            out_stream->push("|bl", read_index);
        } else {
            *out_stream << std::boolalpha;
            out_stream->push(a.asBoolean(), read_index);
        }

        break;

    case Atom::WILDCARD:
        if (after_tail_wildcard) {
            out_stream->push();
        } else {
            out_stream->push(':', read_index);
        }

        break;

    case Atom::T_WILDCARD:
        out_stream->push("::", read_index);
        after_tail_wildcard = true;
        break;

    case Atom::NODE:
        if (a.readsAsNil()) {
            out_stream->push("|sid", read_index);
        } else {
            out_stream->push("0x", read_index);
            *out_stream << std::hex;
            *out_stream << a.atom;
        }

        break;

    case Atom::DEVICE:
        if (a.readsAsNil()) {
            out_stream->push("|did", read_index);
        } else {
            out_stream->push("0x", read_index);
            *out_stream << std::hex;
            *out_stream << a.atom;
        }

        break;

    case Atom::DEVICE_FUNCTION:
        if (a.readsAsNil()) {
            out_stream->push("|fid", read_index);
        } else {
            out_stream->push(metadata->function_names[a.asOpcode()], read_index);
        }

        break;

    case Atom::VIEW:
        out_stream->push("vw", read_index);
        break;

    case Atom::MKS:
        out_stream->push("mks", read_index);
        break;

    case Atom::VWS:
        out_stream->push("vws", read_index);
        break;

    default:
        // out_stream->push("undefined-atom",read_index).
        out_stream->push("0x", read_index);
        *out_stream << std::hex;
        *out_stream << a.atom;
        break;
    }
}